

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.cpp
# Opt level: O0

void __thiscall EOPlus::Context::DoActions(Context *this)

{
  bool bVar1;
  uint uVar2;
  runtime_error *prVar3;
  deque<EOPlus::Action,_std::allocator<EOPlus::Action>_> *this_00;
  reference pAVar4;
  undefined1 local_200 [8];
  Action action;
  const_iterator __end2;
  const_iterator __begin2;
  deque<EOPlus::Action,_std::allocator<EOPlus::Action>_> *__range2;
  anon_class_8_1_8991fb9c aStack_28;
  bool last_cond;
  anon_class_8_1_8991fb9c do_action;
  Context *this_local;
  
  if (this->state == (State *)0x0) {
    if ((this->finished & 1U) == 0) {
      prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar3,"No state selected");
      __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  else {
    if (100 < recursive_depth + 1) {
      prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar3,"Quest action recursion too deep");
      __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    __range2._7_1_ = 0;
    this_00 = &this->state->actions;
    recursive_depth = recursive_depth + 1;
    aStack_28.this = this;
    std::deque<EOPlus::Action,_std::allocator<EOPlus::Action>_>::begin
              ((const_iterator *)&__end2._M_node,this_00);
    std::deque<EOPlus::Action,_std::allocator<EOPlus::Action>_>::end
              ((const_iterator *)
               &action.expr.args.super__Deque_base<util::variant,_std::allocator<util::variant>_>.
                _M_impl.super__Deque_impl_data._M_finish._M_node,this_00);
    while (bVar1 = std::operator!=((_Self *)&__end2._M_node,
                                   (_Self *)&action.expr.args.
                                             super__Deque_base<util::variant,_std::allocator<util::variant>_>
                                             ._M_impl.super__Deque_impl_data._M_finish._M_node),
          bVar1) {
      pAVar4 = std::_Deque_iterator<EOPlus::Action,_const_EOPlus::Action_&,_const_EOPlus::Action_*>
               ::operator*((_Deque_iterator<EOPlus::Action,_const_EOPlus::Action_&,_const_EOPlus::Action_*>
                            *)&__end2._M_node);
      Action::Action((Action *)local_200,pAVar4);
      if (((local_200._0_4_ != ElseIf) && (local_200._0_4_ != Else)) || (__range2._7_1_ == 0)) {
        if ((local_200._0_4_ == If) || (local_200._0_4_ == ElseIf)) {
          uVar2 = (*this->_vptr_Context[2])(this,&action);
          __range2._7_1_ = (byte)uVar2 & 1;
          if ((uVar2 & 1) != 0) {
            DoActions::anon_class_8_1_8991fb9c::operator()
                      (&stack0xffffffffffffffd8,(Action *)local_200);
          }
        }
        else {
          DoActions::anon_class_8_1_8991fb9c::operator()
                    (&stack0xffffffffffffffd8,(Action *)local_200);
        }
      }
      Action::~Action((Action *)local_200);
      std::_Deque_iterator<EOPlus::Action,_const_EOPlus::Action_&,_const_EOPlus::Action_*>::
      operator++((_Deque_iterator<EOPlus::Action,_const_EOPlus::Action_&,_const_EOPlus::Action_*> *)
                 &__end2._M_node);
    }
    recursive_depth = recursive_depth + -1;
    CheckRules(this);
  }
  return;
}

Assistant:

void Context::DoActions()
	{
		if (!this->state)
		{
			if (this->finished)
				return;
			else
				throw std::runtime_error("No state selected");
		}

		if (++recursive_depth > max_recursion)
		{
			--recursive_depth;
			throw std::runtime_error("Quest action recursion too deep");
		}

		try
		{
			auto do_action = [&](const EOPlus::Action& action)
			{
				if (this->DoAction(action))
				{
					// *this may not be valid here
					--recursive_depth;
					return;
				}
			};

			bool last_cond = false;

			UTIL_FOREACH(this->state->actions, action)
			{
				if (action.cond == EOPlus::Action::ElseIf || action.cond == EOPlus::Action::Else)
				{
					if (last_cond)
						continue;
				}

				if (action.cond == EOPlus::Action::If || action.cond == EOPlus::Action::ElseIf)
				{
					last_cond = this->CheckRule(action.cond_expr);

					if (last_cond)
						do_action(action);
				}
				else
				{
					do_action(action);
				}
			}
		}
		catch (...)
		{
			--recursive_depth;
			throw;
		}

		--recursive_depth;
		this->CheckRules();
	}